

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  vector<char,_std::allocator<char>_> *this;
  AtFileStackEntry *__location;
  _Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true> _Var1;
  pointer paVar2;
  FILE *pFVar3;
  pointer pAVar4;
  pointer pAVar5;
  pointer puVar6;
  _Alloc_hider _Var7;
  uint16_t uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  long lVar16;
  ulong uVar17;
  pointer __result;
  pointer pAVar18;
  undefined4 extraout_var;
  int *piVar19;
  char *pcVar20;
  string *__a;
  _Tp_alloc_type *__alloc;
  uint uVar21;
  int *__args;
  int *extraout_RDX;
  optional<std::filesystem::__cxx11::path> *path;
  optional<std::filesystem::__cxx11::path> *path_00;
  optional<std::filesystem::__cxx11::path> *path_01;
  optional<std::filesystem::__cxx11::path> *path_02;
  optional<std::filesystem::__cxx11::path> *path_03;
  char cVar22;
  char **argv_00;
  ulong uVar23;
  Rgba *this_00;
  ulong uVar24;
  pointer puVar25;
  optional<std::filesystem::__cxx11::path> *this_01;
  vector<char_*,_std::allocator<char_*>_> *this_02;
  size_t i;
  bool bVar26;
  initializer_list<char_*> __l;
  vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> atFileStack;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  string local_178;
  char *local_158;
  File file;
  path local_58;
  
  atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar24 = (ulong)(uint)argc;
  argv_00 = argv;
LAB_00103b47:
  while( true ) {
    iVar10 = (int)uVar24;
    uVar9 = musl_getopt_long_only
                      (iVar10,argv_00,"-Aa:b:Cc:Dd:FfhL:mN:n:Oo:Pp:Qq:r:s:Tt:U:uVvx:Z",longopts,
                       (int *)0x0);
    if (uVar9 != 0xffffffff) break;
    lVar16 = (long)musl_optind;
    if (musl_optind != iVar10) {
      if (iVar10 <= musl_optind) {
        __assert_fail("musl_optind < curArgc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/main.cpp"
                      ,0x276,"main");
      }
      for (; lVar16 < iVar10; lVar16 = lVar16 + 1) {
        registerInput(argv[lVar16]);
      }
    }
    pAVar5 = atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pAVar4 = atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_start ==
        atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar9 = (uint)options.nbColorsPerPal;
      pcVar20 = (char *)(ulong)(uint)options.bitDepth;
      uVar21 = 1 << (options.bitDepth & 0x1f);
      if (uVar9 == 0) {
        options.nbColorsPerPal = (uint8_t)uVar21;
      }
      else if (uVar21 < uVar9) {
        pcVar20 = (char *)(ulong)uVar9;
        error("%ubpp palettes can only contain %u colors, not %u",(ulong)(uint)options.bitDepth);
      }
      main::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_1,true,
                 (optional<std::filesystem::__cxx11::path> *)".attrmap",pcVar20);
      main::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_2,true,
                 (optional<std::filesystem::__cxx11::path> *)".tilemap",pcVar20);
      main::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_3,true,
                 (optional<std::filesystem::__cxx11::path> *)".pal",pcVar20);
      main::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_4,true,
                 (optional<std::filesystem::__cxx11::path> *)".palmap",pcVar20);
      if (_ZL12localOptions_0._M_storage != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
        parseExternalPalSpec((char *)_ZL12localOptions_0._M_storage);
      }
      pFVar3 = _stderr;
      if (options.verbosity != '\0') {
        pcVar20 = get_package_version_string();
        fprintf(pFVar3,"rgbgfx %s\n",pcVar20);
        if (5 < options.verbosity) {
          putc(10,_stderr);
          for (uVar24 = 0; uVar24 != 0x15; uVar24 = uVar24 + 1) {
            uVar9 = (uint)main::gfx._M_elems[uVar24];
            cVar22 = '\n';
            while (bVar26 = cVar22 != '\0', cVar22 = cVar22 + -1, bVar26) {
              uVar21 = (uVar9 & 1) << 4 | 0x20;
              putc(uVar21,_stderr);
              putc(uVar21,_stderr);
              uVar9 = uVar9 >> 1;
            }
            if (uVar24 < 3) {
              fputs(main::textbox._M_elems[uVar24],_stderr);
            }
            putc(10,_stderr);
          }
          putc(10,_stderr);
        }
        fputs("Options:\n",_stderr);
        if (options.columnMajor == true) {
          fputs("\tVisit image in column-major order\n",_stderr);
        }
        if (options.allowMirroring == true) {
          fputs("\tAllow mirroring tiles\n",_stderr);
        }
        if (options.allowDedup == true) {
          fputs("\tAllow deduplicating tiles\n",_stderr);
        }
        if (options.useColorCurve == true) {
          fputs("\tUse color curve\n",_stderr);
        }
        fprintf(_stderr,"\tBit depth: %ubpp\n",(ulong)options.bitDepth);
        if (options.trim != 0) {
          fprintf(_stderr,"\tTrim the last %lu tiles\n");
        }
        fprintf(_stderr,"\tMaximum %u palettes\n",(ulong)options.nbPalettes);
        fprintf(_stderr,"\tPalettes contain %u colors\n",(ulong)options.nbColorsPerPal);
        if ((ulong)options.palSpecType < 3) {
          pcVar20 = &DAT_0011412c + *(int *)(&DAT_0011412c + (ulong)options.palSpecType * 4);
        }
        else {
          pcVar20 = "???";
        }
        fprintf(_stderr,"\t%s palette spec\n",pcVar20);
        if (options.palSpecType == EXPLICIT) {
          fputs("\t[\n",_stderr);
          paVar2 = options.palSpec.
                   super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (this_00 = (options.palSpec.
                          super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems; pFVar3 = _stderr,
              this_00 != paVar2->_M_elems; this_00 = this_00 + 4) {
            uVar12 = Rgba::toCSS(this_00);
            uVar13 = Rgba::toCSS(this_00 + 1);
            uVar14 = Rgba::toCSS(this_00 + 2);
            uVar15 = Rgba::toCSS(this_00 + 3);
            fprintf(pFVar3,"\t\t#%06x, #%06x, #%06x, #%06x,\n",(ulong)(uVar12 >> 8),
                    (ulong)(uVar13 >> 8),(ulong)(uVar14 >> 8),(ulong)(uVar15 >> 8));
          }
          fputs("\t]\n",_stderr);
        }
        fprintf(_stderr,"\tInput image slice: %ux%u pixels starting at (%i, %i)\n",
                (ulong)options.inputSlice.width,(ulong)options.inputSlice.height,
                (ulong)options.inputSlice.left,(ulong)options.inputSlice.top);
        fprintf(_stderr,"\tBase tile IDs: [%u, %u]\n",(ulong)options.baseTileIDs._M_elems[0],
                (ulong)options.baseTileIDs._M_elems[1]);
        fprintf(_stderr,"\tMaximum %u tiles in bank 0, %u in bank 1\n",
                (ulong)options.maxNbTiles._M_elems[0],(ulong)options.maxNbTiles._M_elems[1]);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"Input image",(char *)&options.input,path);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"Output tile data",(char *)&options.output,path_00);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"Output tilemap",(char *)&options.tilemap,path_01);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"Output attrmap",(char *)&options.attrmap,path_02);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)"Output palettes",(char *)&options.palettes,path_03);
        fputs("Ready.\n",_stderr);
      }
      if (nbErrors == 0) {
        if (options.input.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
            _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
            super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
          if (options.reversedWidth == 0) {
            process();
          }
          else {
            reverse();
          }
        }
        else {
          if (((options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
                _M_payload.
                super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
                super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != true) ||
              (options.palSpecType != EXPLICIT)) || (options.reversedWidth != 0)) {
            fputs("FATAL: No input image specified\n",_stderr);
            goto LAB_00104b3f;
          }
          processPalettes();
        }
        if (nbErrors == 0) {
          std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::~vector(&atFileStack);
          return 0;
        }
      }
      giveUp();
    }
    __location = atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
    musl_optind = atFileStack.
                  super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].parentInd;
    atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = __location;
    std::destroy_at<main::AtFileStackEntry>(__location);
    uVar24 = (ulong)(uint)argc;
    argv_00 = argv;
    if (pAVar4 != __location) {
      argv_00 = pAVar5[-2].argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar24 = (ulong)((long)pAVar5[-2].argv.super__Vector_base<char_*,_std::allocator<char_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)argv_00) >> 3;
    }
  }
  _Var1._M_storage = (basic_streambuf<char,_std::char_traits<char>_> *)musl_optarg;
  file._file.
  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
  _M_first._M_storage =
       (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
       (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)musl_optarg;
  switch(uVar9) {
  case 0x41:
switchD_00103b85_caseD_41:
    _ZL12localOptions_1 = 1;
    goto LAB_00103b47;
  case 0x42:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x52:
  case 0x53:
  case 0x55:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x77:
    goto switchD_00103b85_caseD_42;
  case 0x43:
    options.useColorCurve = true;
    goto LAB_00103b47;
  case 0x4c:
    options.inputSlice.left = parseNumber((char **)&file,"Input slice left coordinate",0xffff);
    if ((short)options.inputSlice.left < 0) {
      pcVar20 = "Input slice left coordinate is out of range!";
      goto LAB_00104205;
    }
    skipWhitespace((char **)&file);
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == ',') {
      file._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           ((long)file._file.
                  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  ._M_u._M_first._M_storage + 1);
      skipWhitespace((char **)&file);
      options.inputSlice.top = parseNumber((char **)&file,"Input slice upper coordinate",0xffff);
      skipWhitespace((char **)&file);
      if (*(char *)file._file.
                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                   .
                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .
                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   ._M_u._M_first._M_storage == ':') {
        file._file.
        super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
        .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
        super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
        _M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             ((long)file._file.
                    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                    .
                    super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .
                    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    .
                    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                    ._M_u._M_first._M_storage + 1);
        skipWhitespace((char **)&file);
        uVar8 = parseNumber((char **)&file,"Input slice width",0xffff);
        options.inputSlice.width = uVar8;
        skipWhitespace((char **)&file);
        if (uVar8 == 0) {
          error("Input slice width may not be 0!");
        }
        if (*(char *)file._file.
                     super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                     .
                     super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     .
                     super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                     ._M_u._M_first._M_storage == ',') {
          file._file.
          super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
          .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
          super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u
          ._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               ((long)file._file.
                      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                      .
                      super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      .
                      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                      ._M_u._M_first._M_storage + 1);
          skipWhitespace((char **)&file);
          options.inputSlice.height = parseNumber((char **)&file,"Input slice height",0xffff);
          if (options.inputSlice.height == 0) {
            error("Input slice height may not be 0!");
          }
          if (*(char *)file._file.
                       super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                       .
                       super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       .
                       super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                       ._M_u._M_first._M_storage == '\0') goto LAB_00103b47;
          pcVar20 = "Unexpected extra characters after slice spec in \"%s\"";
        }
        else {
          pcVar20 = "Missing comma after width in \"%s\"";
        }
      }
      else {
        pcVar20 = "Missing colon after upper coordinate in \"%s\"";
      }
    }
    else {
      pcVar20 = "Missing comma after left coordinate in \"%s\"";
    }
    break;
  case 0x4e:
    options.maxNbTiles._M_elems[0] = parseNumber((char **)&file,"Number of tiles in bank 0",0x100);
    if (0x100 < options.maxNbTiles._M_elems[0]) {
      error("Bank 0 cannot contain more than 256 tiles");
    }
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == '\0') {
      options.maxNbTiles._M_elems[1] = 0;
      goto LAB_00103b47;
    }
    skipWhitespace((char **)&file);
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == ',') {
      file._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           ((long)file._file.
                  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  ._M_u._M_first._M_storage + 1);
      skipWhitespace((char **)&file);
      options.maxNbTiles._M_elems[1] = parseNumber((char **)&file,"Number of tiles in bank 1",0x100)
      ;
      if (0x100 < options.maxNbTiles._M_elems[1]) {
        error("Bank 1 cannot contain more than 256 tiles");
      }
      if (*(char *)file._file.
                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                   .
                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .
                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   ._M_u._M_first._M_storage == '\0') goto LAB_00103b47;
    }
    pcVar20 = "Bank capacity must be one or two comma-separated numbers, not \"%s\"";
    break;
  case 0x4f:
    _ZL12localOptions_5 = 1;
    goto LAB_00103b47;
  case 0x50:
switchD_00103b85_caseD_50:
    _ZL12localOptions_3 = 1;
    goto LAB_00103b47;
  case 0x51:
switchD_00103b85_caseD_51:
    _ZL12localOptions_4 = 1;
    goto LAB_00103b47;
  case 0x54:
switchD_00103b85_caseD_54:
    _ZL12localOptions_2 = 1;
    goto LAB_00103b47;
  case 0x56:
    pcVar20 = get_package_version_string();
    printf("rgbgfx %s\n",pcVar20);
    exit(0);
  case 0x5a:
    options.columnMajor = true;
    goto LAB_00103b47;
  case 0x61:
    _ZL12localOptions_1 = 0;
    this_01 = &options.attrmap;
    if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
      pcVar20 = "Overriding attrmap file %s";
LAB_00104115:
      warning(pcVar20,(pointer)(this_01->
                               super__Optional_base<std::filesystem::__cxx11::path,_false,_false>).
                               _M_payload.
                               super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>
                               .super__Optional_payload_base<std::filesystem::__cxx11::path>.
                               _M_payload._M_value._M_pathname._M_dataplus);
    }
    goto LAB_00104120;
  case 0x62:
    uVar8 = parseNumber((char **)&file,"Bank 0 base tile ID",0);
    options.baseTileIDs._M_elems[0] = (uchar)uVar8;
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == '\0') {
      options.baseTileIDs._M_elems[1] = '\0';
      goto LAB_00103b47;
    }
    skipWhitespace((char **)&file);
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == ',') {
      file._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           ((long)file._file.
                  super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                  .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                  super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                  ._M_u._M_first._M_storage + 1);
      skipWhitespace((char **)&file);
      uVar8 = parseNumber((char **)&file,"Bank 1 base tile ID",0);
      options.baseTileIDs._M_elems[1] = (uchar)uVar8;
      if (*(char *)file._file.
                   super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                   .
                   super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .
                   super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   .super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                   super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                   ._M_u._M_first._M_storage == '\0') goto LAB_00103b47;
    }
    pcVar20 = "Base tile IDs must be one or two comma-separated numbers, not \"%s\"";
    break;
  case 99:
    if (*musl_optarg == '#') {
      options.palSpecType = EXPLICIT;
      parseInlinePalSpec(musl_optarg);
    }
    else {
      iVar10 = strcasecmp(musl_optarg,"embedded");
      if (iVar10 == 0) {
        options.palSpecType = EMBEDDED;
      }
      else {
        options.palSpecType = EXPLICIT;
        _ZL12localOptions_0._M_storage = _Var1._M_storage;
      }
    }
    goto LAB_00103b47;
  case 100:
    uVar8 = parseNumber((char **)&file,"Bit depth",2);
    options.bitDepth = (uint8_t)uVar8;
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == '\0') {
      if ((ushort)((uVar8 & 0xff) - 3) < 0xfffe) {
        error("Bit depth must be 1 or 2, not %u");
        options.bitDepth = '\x02';
      }
      goto LAB_00103b47;
    }
    pcVar20 = "Bit depth (-b) argument must be a valid number, not \"%s\"";
    break;
  case 0x6d:
    options.allowMirroring = true;
  case 0x75:
    options.allowDedup = true;
    goto LAB_00103b47;
  case 0x6e:
    uVar8 = parseNumber((char **)&file,"Number of palettes",0x100);
    options.nbPalettes = (uint8_t)uVar8;
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage != '\0') {
      error("Number of palettes (-n) must be a valid number, not \"%s\"",musl_optarg);
    }
    if (options.nbPalettes == '\0') {
      pcVar20 = "Number of palettes (-n) may not be 0!";
      goto LAB_00104205;
    }
    goto LAB_00103b47;
  case 0x6f:
    this_01 = &options.output;
    if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
      pcVar20 = "Overriding tile data file %s";
      goto LAB_00104115;
    }
    goto LAB_00104120;
  case 0x70:
    _ZL12localOptions_3 = 0;
    this_01 = &options.palettes;
    if (options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
      pcVar20 = "Overriding palettes file %s";
      goto LAB_00104115;
    }
    goto LAB_00104120;
  case 0x71:
    _ZL12localOptions_4 = 0;
    this_01 = &options.palmap;
    if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload
        .super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
      pcVar20 = "Overriding palette map file %s";
      goto LAB_00104115;
    }
    goto LAB_00104120;
  case 0x72:
    options.reversedWidth = parseNumber((char **)&file,"Reversed image stride",0xffff);
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage != '\0') {
      error("Reversed image stride (-r) must be a valid number, not \"%s\"",musl_optarg);
    }
    if (options.reversedWidth == 0) {
      pcVar20 = "Reversed image stride (-r) may not be 0!";
      goto LAB_00104205;
    }
    goto LAB_00103b47;
  case 0x73:
    uVar8 = parseNumber((char **)&file,"Number of colors per palette",4);
    options.nbColorsPerPal = (uint8_t)uVar8;
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage != '\0') {
      error("Palette size (-s) must be a valid number, not \"%s\"",musl_optarg);
    }
    if (options.nbColorsPerPal < 5) {
      if (options.nbColorsPerPal != '\0') goto LAB_00103b47;
      pcVar20 = "Palette size (-s) may not be 0!";
    }
    else {
      pcVar20 = "Palette size (-s) must not exceed 4!";
    }
LAB_00104205:
    error(pcVar20);
    goto LAB_00103b47;
  case 0x74:
    _ZL12localOptions_2 = 0;
    this_01 = &options.tilemap;
    if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
        _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
        super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
      pcVar20 = "Overriding tilemap file %s";
      goto LAB_00104115;
    }
LAB_00104120:
    std::optional<std::filesystem::__cxx11::path>::operator=(this_01,&musl_optarg);
    goto LAB_00103b47;
  case 0x76:
    if (options.verbosity < 6) {
      options.verbosity = options.verbosity + '\x01';
    }
    goto LAB_00103b47;
  case 0x78:
    uVar8 = parseNumber((char **)&file,"Number of tiles to trim",0);
    options.trim = (uint64_t)uVar8;
    if (*(char *)file._file.
                 super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                 .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
                 super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>
                 ._M_u._M_first._M_storage == '\0') goto LAB_00103b47;
    pcVar20 = "Tile trim (-x) argument must be a valid number, not \"%s\"";
    break;
  default:
    if (uVar9 == 0xffffffac) {
      warning("`--output-tilemap` is deprecated, use `--auto-tilemap` instead");
      goto switchD_00103b85_caseD_54;
    }
    if (uVar9 == 0xffffffaf) {
      warning("`--output-palette-map` is deprecated, use `--auto-palette-map` instead");
      goto switchD_00103b85_caseD_51;
    }
    if (uVar9 == 0xffffffb0) {
      warning("`--output-palette` is deprecated, use `--auto-palette` instead");
      goto switchD_00103b85_caseD_50;
    }
    if (uVar9 == 1) goto LAB_0010414e;
    if (uVar9 == 0xffffffbf) {
      warning("`--output-attr-map` is deprecated, use `--auto-attr-map` instead");
      goto switchD_00103b85_caseD_41;
    }
switchD_00103b85_caseD_42:
    fprintf(_stderr,"FATAL: unknown option \'%c\'\n",(ulong)uVar9);
LAB_00104b3f:
    printUsage();
    exit(1);
  }
  error(pcVar20,musl_optarg);
  goto LAB_00103b47;
LAB_0010414e:
  if (*musl_optarg == '@') {
    local_58._M_pathname._M_dataplus._M_p = musl_optarg + 1;
    __a = &local_178;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_58;
    std::vector<char_*,_std::allocator<char_*>_>::vector
              ((vector<char_*,_std::allocator<char_*>_> *)&file,__l,(allocator_type *)__a);
    pAVar5 = atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pAVar4 = atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      lVar16 = (long)atFileStack.
                     super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)atFileStack.
                     super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl
                     .super__Vector_impl_data._M_start;
      if (lVar16 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar17 = lVar16 / 0x38;
      piVar19 = (int *)(lVar16 % 0x38);
      uVar24 = uVar17;
      if (atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        uVar24 = 1;
      }
      uVar23 = uVar24 + uVar17;
      __alloc = (_Tp_alloc_type *)0x249249249249249;
      if (0x249249249249248 < uVar23) {
        uVar23 = 0x249249249249249;
      }
      if (CARRY8(uVar24,uVar17)) {
        uVar23 = 0x249249249249249;
      }
      if (uVar23 == 0) {
        __result = (pointer)0x0;
      }
      else {
        __result = (pointer)operator_new(uVar23 * 0x38);
        piVar19 = extraout_RDX;
      }
      std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
      construct<main::AtFileStackEntry,int&,std::vector<char*,std::allocator<char*>>>
                ((allocator_type *)(__result + uVar17),(AtFileStackEntry *)&file,piVar19,
                 (vector<char_*,_std::allocator<char_*>_> *)__alloc);
      pAVar18 = std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::_S_relocate
                          (pAVar4,pAVar5,__result,__alloc);
      pAVar18 = std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::_S_relocate
                          (pAVar5,pAVar5,pAVar18 + 1,__alloc);
      std::_Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::_M_deallocate
                ((_Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> *)pAVar4,
                 (pointer)(((long)atFileStack.
                                  super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar4)
                          / 0x38),
                 ((long)atFileStack.
                        super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar4) % 0x38);
      atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __result + uVar23;
      atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
      super__Vector_impl_data._M_start = __result;
    }
    else {
      std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
      construct<main::AtFileStackEntry,int&,std::vector<char*,std::allocator<char*>>>
                ((allocator_type *)
                 atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(AtFileStackEntry *)&file,__args,
                 (vector<char_*,_std::allocator<char_*>_> *)__a);
      pAVar18 = pAVar5 + 1;
    }
    atFileStack.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar18;
    std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
              ((_Vector_base<char_*,_std::allocator<char_*>_> *)&file);
    local_158 = musl_optarg + 1;
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              (&local_58,&local_158,auto_format);
    file._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
    _M_first._M_storage =
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
         (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
    file._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_index =
         '\0';
    iVar10 = File::open(&file,(char *)&local_58,8);
    if (CONCAT44(extraout_var,iVar10) == 0) {
      File::string(&local_178,&file,&local_58);
      _Var7._M_p = local_178._M_dataplus._M_p;
      piVar19 = __errno_location();
      pcVar20 = strerror(*piVar19);
      fatal("Error reading @%s: %s",_Var7._M_p,pcVar20);
    }
    this = &pAVar18[-1].argPool;
    offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      File::operator*(&file);
      iVar10 = std::streambuf::sbumpc();
      if (iVar10 == -1) break;
      iVar11 = isblank(iVar10);
      if ((iVar11 == 0) && (iVar10 != 10)) {
        if (iVar10 == 0xd) {
          File::operator*(&file);
          std::streambuf::sbumpc();
        }
        else if (iVar10 == 0x23) {
          do {
            File::operator*(&file);
            iVar10 = std::streambuf::sbumpc();
            if (iVar10 == -1) goto LAB_001045ed;
          } while (iVar10 != 10);
        }
        else {
          do {
            local_178._M_dataplus._M_p =
                 pAVar18[-1].argPool.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 -(long)pAVar18[-1].argPool.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                      (&offsets,(unsigned_long *)&local_178);
            local_178._M_dataplus._M_p._0_1_ = (char)iVar10;
            std::vector<char,_std::allocator<char>_>::emplace_back<char>(this,(char *)&local_178);
            while( true ) {
              File::operator*(&file);
              iVar10 = std::streambuf::sbumpc();
              if (((iVar10 == -1) || (iVar10 == 10)) || (iVar11 = isblank(iVar10), iVar11 != 0))
              goto LAB_00104573;
              if (iVar10 == 0xd) break;
              local_178._M_dataplus._M_p._0_1_ = (char)iVar10;
              std::vector<char,_std::allocator<char>_>::emplace_back<char>(this,(char *)&local_178);
            }
            File::operator*(&file);
            std::streambuf::sbumpc();
LAB_00104573:
            local_178._M_dataplus._M_p = local_178._M_dataplus._M_p & 0xffffffffffffff00;
            std::vector<char,_std::allocator<char>_>::emplace_back<char>(this,(char *)&local_178);
            while (iVar11 = isblank(iVar10), iVar11 != 0) {
              File::operator*(&file);
              iVar10 = std::streambuf::sbumpc();
            }
            if (iVar10 == 0xd) {
              File::operator*(&file);
              iVar10 = std::streambuf::sbumpc();
            }
          } while ((iVar10 != -1) && (iVar10 != 10));
        }
      }
    }
LAB_001045ed:
    File::~File(&file);
    std::filesystem::__cxx11::path::~path(&local_58);
    this_02 = &pAVar18[-1].argv;
    std::vector<char_*,_std::allocator<char_*>_>::reserve
              (this_02,((long)offsets.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)offsets.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) + 2);
    puVar6 = offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar25 = offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_start; puVar25 != puVar6; puVar25 = puVar25 + 1) {
      file._file.
      super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
      .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
      super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
      _M_first._M_storage =
           (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
           ((this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start + *puVar25);
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)this_02,(char **)&file);
    }
    file._file.
    super__Variant_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
    .super__Move_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_assign_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Move_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Copy_ctor_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>.
    super__Variant_storage_alias<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>._M_u.
    _M_first._M_storage =
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
         (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)this_02,(char **)&file);
    argv_00 = pAVar18[-1].argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar24 = (ulong)((int)((ulong)((long)pAVar18[-1].argv.
                                         super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)argv_00) >> 3) -
                    1);
    musl_optind = 1;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    registerInput(musl_optarg);
  }
  goto LAB_00103b47;
}

Assistant:

int main(int argc, char *argv[]) {
	struct AtFileStackEntry {
		int parentInd; // Saved offset into parent argv
		std::vector<char *> argv; // This context's arg pointer vec
		std::vector<char> argPool;

		AtFileStackEntry(int parentInd_, std::vector<char *> argv_)
		    : parentInd(parentInd_), argv(argv_) {}
	};
	std::vector<AtFileStackEntry> atFileStack;

	int curArgc = argc;
	char **curArgv = argv;
	for (;;) {
		char *atFileName = parseArgv(curArgc, curArgv);
		if (atFileName) {
			// Copy `argv[0]` for error reporting, and because option parsing skips it
			AtFileStackEntry &stackEntry =
			    atFileStack.emplace_back(musl_optind, std::vector{atFileName});
			// It would be nice to compute the char pointers on the fly, but reallocs don't allow
			// that; so we must compute the offsets after the pool is fixed
			auto offsets = readAtFile(&musl_optarg[1], stackEntry.argPool);
			stackEntry.argv.reserve(offsets.size() + 2); // Avoid a bunch of reallocs
			for (size_t ofs : offsets) {
				stackEntry.argv.push_back(&stackEntry.argPool.data()[ofs]);
			}
			stackEntry.argv.push_back(nullptr); // Don't forget the arg vector terminator!

			curArgc = stackEntry.argv.size() - 1;
			curArgv = stackEntry.argv.data();
			musl_optind = 1; // Don't use 0 because we're not scanning a different argv per se
			continue; // Begin scanning that arg vector
		}

		if (musl_optind != curArgc) {
			// This happens if `--` is passed, process the remaining arg(s) as positional
			assert(musl_optind < curArgc);
			for (int i = musl_optind; i < curArgc; ++i) {
				registerInput(argv[i]);
			}
		}

		// Pop off the top stack entry, or end parsing if none
		if (atFileStack.empty()) {
			break;
		}
		// OK to restore `optind` directly, because `optpos` must be 0 right now.
		// (Providing 0 would be a "proper" reset, but we want to resume parsing)
		musl_optind = atFileStack.back().parentInd;
		atFileStack.pop_back();
		if (atFileStack.empty()) {
			curArgc = argc;
			curArgv = argv;
		} else {
			auto &vec = atFileStack.back().argv;
			curArgc = vec.size();
			curArgv = vec.data();
		}
	}

	if (options.nbColorsPerPal == 0) {
		options.nbColorsPerPal = 1u << options.bitDepth;
	} else if (options.nbColorsPerPal > 1u << options.bitDepth) {
		error("%" PRIu8 "bpp palettes can only contain %u colors, not %" PRIu8, options.bitDepth,
		      1u << options.bitDepth, options.nbColorsPerPal);
	}

	auto autoOutPath = [](bool autoOptEnabled, std::optional<std::filesystem::path> &path,
	                      char const *extension) {
		if (autoOptEnabled) {
			auto image = localOptions.groupOutputs ? options.output : options.input;
			if (!image.has_value()) {
				fprintf(stderr, "FATAL: No %s specified\n", localOptions.groupOutputs
				      ? "output tile data file" : "input image");
				printUsage();
				exit(1);
			}
			path.emplace(*image).replace_extension(extension);
		}
	};
	autoOutPath(localOptions.autoAttrmap, options.attrmap, ".attrmap");
	autoOutPath(localOptions.autoTilemap, options.tilemap, ".tilemap");
	autoOutPath(localOptions.autoPalettes, options.palettes, ".pal");
	autoOutPath(localOptions.autoPalmap, options.palmap, ".palmap");

	// Execute deferred external pal spec parsing, now that all other params are known
	if (localOptions.externalPalSpec) {
		parseExternalPalSpec(localOptions.externalPalSpec);
	}

	if (options.verbosity >= Options::VERB_CFG) {
		fprintf(stderr, "rgbgfx %s\n", get_package_version_string());

		if (options.verbosity >= Options::VERB_VVVVVV) {
			putc('\n', stderr);
			static std::array<uint16_t, 21> gfx{
			    0x1FE, 0x3FF, 0x399, 0x399, 0x3FF, 0x3FF, 0x381, 0x3C3, 0x1FE, 0x078, 0x1FE,
			    0x3FF, 0x3FF, 0x3FF, 0x37B, 0x37B, 0x0FC, 0x0CC, 0x1CE, 0x1CE, 0x1CE,
			};
			static std::array<char const *, 3> textbox{
			    "  ,----------------------------------------.",
			    "  | Augh, dimensional interference again?! |",
			    "  `----------------------------------------'"};
			for (size_t i = 0; i < gfx.size(); ++i) {
				uint16_t row = gfx[i];
				for (uint8_t _ = 0; _ < 10; ++_) {
					unsigned char c = row & 1 ? '0' : ' ';
					putc(c, stderr);
					// Double the pixel horizontally, otherwise the aspect ratio looks wrong
					putc(c, stderr);
					row >>= 1;
				}
				if (i < textbox.size()) {
					fputs(textbox[i], stderr);
				}
				putc('\n', stderr);
			}
			putc('\n', stderr);
		}

		fputs("Options:\n", stderr);
		if (options.columnMajor)
			fputs("\tVisit image in column-major order\n", stderr);
		if (options.allowMirroring)
			fputs("\tAllow mirroring tiles\n", stderr);
		if (options.allowDedup)
			fputs("\tAllow deduplicating tiles\n", stderr);
		if (options.useColorCurve)
			fputs("\tUse color curve\n", stderr);
		fprintf(stderr, "\tBit depth: %" PRIu8 "bpp\n", options.bitDepth);
		if (options.trim != 0)
			fprintf(stderr, "\tTrim the last %" PRIu64 " tiles\n", options.trim);
		fprintf(stderr, "\tMaximum %" PRIu8 " palettes\n", options.nbPalettes);
		fprintf(stderr, "\tPalettes contain %" PRIu8 " colors\n", options.nbColorsPerPal);
		fprintf(stderr, "\t%s palette spec\n", []() {
			switch (options.palSpecType) {
			case Options::NO_SPEC:
				return "No";
			case Options::EXPLICIT:
				return "Explicit";
			case Options::EMBEDDED:
				return "Embedded";
			}
			return "???";
		}());
		if (options.palSpecType == Options::EXPLICIT) {
			fputs("\t[\n", stderr);
			for (std::array<Rgba, 4> const &pal : options.palSpec) {
				fprintf(stderr, "\t\t#%06x, #%06x, #%06x, #%06x,\n", pal[0].toCSS() >> 8,
				        pal[1].toCSS() >> 8, pal[2].toCSS() >> 8, pal[3].toCSS() >> 8);
			}
			fputs("\t]\n", stderr);
		}
		fprintf(stderr,
		        "\tInput image slice: %" PRIu32 "x%" PRIu32 " pixels starting at (%" PRIi32
		        ", %" PRIi32 ")\n",
		        options.inputSlice.width, options.inputSlice.height, options.inputSlice.left,
		        options.inputSlice.top);
		fprintf(stderr, "\tBase tile IDs: [%" PRIu8 ", %" PRIu8 "]\n", options.baseTileIDs[0],
		        options.baseTileIDs[1]);
		fprintf(stderr, "\tMaximum %" PRIu16 " tiles in bank 0, %" PRIu16 " in bank 1\n",
		        options.maxNbTiles[0], options.maxNbTiles[1]);
		auto printPath = [](char const *name,
		                    std::optional<std::filesystem::path> const &path) {
			if (path.has_value()) {
				fprintf(stderr, "\t%s: %s\n", name, path->c_str());
			}
		};
		printPath("Input image", options.input);
		printPath("Output tile data", options.output);
		printPath("Output tilemap", options.tilemap);
		printPath("Output attrmap", options.attrmap);
		printPath("Output palettes", options.palettes);
		fputs("Ready.\n", stderr);
	}

	// Do not do anything if option parsing went wrong
	if (nbErrors) {
		giveUp();
	}

	if (options.input.has_value()) {
		if (options.reverse()) {
			reverse();
		} else {
			process();
		}
	} else if (options.palettes.has_value() && options.palSpecType == Options::EXPLICIT
		&& !options.reverse()) {
		processPalettes();
	} else {
		fputs("FATAL: No input image specified\n", stderr);
		printUsage();
		exit(1);
	}

	if (nbErrors) {
		giveUp();
	}
	return 0;
}